

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void __thiscall
cfd::core::Psbt::SetTxInUtxo
          (Psbt *this,uint32_t index,Transaction *tx,Script *redeem_script,
          vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  pointer *__return_storage_ptr__;
  uint index_00;
  void *pvVar1;
  long lVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  uint32_t uVar6;
  uchar *__s2;
  size_type __n;
  CfdException *pCVar7;
  undefined8 uVar8;
  Script local_318;
  undefined1 local_2da;
  allocator local_2d9;
  string local_2d8;
  CfdSourceLocation local_2b8;
  undefined1 local_29a;
  allocator local_299;
  string local_298;
  CfdSourceLocation local_278;
  undefined1 local_25a;
  allocator local_259;
  string local_258;
  CfdSourceLocation local_238;
  undefined1 local_21a;
  allocator local_219;
  string local_218;
  CfdSourceLocation local_1f8;
  string local_1e0;
  int local_1bc;
  long lStack_1b8;
  int ret;
  wally_tx *wally_tx_obj;
  byte local_171;
  undefined1 local_170 [7];
  bool is_witness;
  Script new_redeem_script;
  TxOutReference txout;
  string local_e0;
  CfdSourceLocation local_c0;
  ByteData local_98;
  undefined1 local_80 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> tx_txid;
  Txid txid;
  uint32_t vout;
  uint8_t *txhash;
  wally_psbt *psbt_pointer;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list_local;
  Script *redeem_script_local;
  Transaction *tx_local;
  uint32_t index_local;
  Psbt *this_local;
  
  (*this->_vptr_Psbt[2])(this,(ulong)index,0x8b9,"SetTxInUtxo");
  pvVar1 = this->wally_psbt_pointer_;
  lVar2 = *(long *)(*(long *)((long)pvVar1 + 8) + 8);
  index_00 = *(uint *)(*(long *)(*(long *)((long)pvVar1 + 8) + 8) + 0x20 + (ulong)index * 0xd0);
  __return_storage_ptr__ =
       &tx_txid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  AbstractTransaction::GetTxid((Txid *)__return_storage_ptr__,&tx->super_AbstractTransaction);
  Txid::GetData(&local_98,(Txid *)__return_storage_ptr__);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80,&local_98);
  ByteData::~ByteData(&local_98);
  __s2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
  __n = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
  iVar5 = memcmp((void *)(lVar2 + (ulong)index * 0xd0),__s2,__n);
  if ((iVar5 != 0) || (uVar6 = Transaction::GetTxOutCount(tx), uVar6 <= index_00)) {
    local_c0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_c0.filename = local_c0.filename + 1;
    local_c0.line = 0x8c2;
    local_c0.funcname = "SetTxInUtxo";
    logger::warn<>(&local_c0,"unmatch outpoint.");
    txout.super_AbstractTxOutReference.locking_script_.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_e0,"unmatch outpoint.",
               (allocator *)
               ((long)&txout.super_AbstractTxOutReference.locking_script_.script_stack_.
                       super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,&local_e0);
    txout.super_AbstractTxOutReference.locking_script_.script_stack_.
    super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  Transaction::GetTxOut
            ((TxOutReference *)
             &new_redeem_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,tx,index_00);
  Script::Script((Script *)local_170,redeem_script);
  AbstractTxOutReference::GetLockingScript
            ((Script *)&wally_tx_obj,
             (AbstractTxOutReference *)
             &new_redeem_script.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar4 = ValidatePsbtUtxo((Txid *)&tx_txid.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,index_00,
                           (Script *)&wally_tx_obj,redeem_script,key_list,(Script *)local_170);
  Script::~Script((Script *)&wally_tx_obj);
  lStack_1b8 = 0;
  local_171 = bVar4;
  AbstractTransaction::GetHex_abi_cxx11_(&local_1e0,&tx->super_AbstractTransaction);
  uVar8 = ::std::__cxx11::string::c_str();
  iVar5 = wally_tx_from_hex(uVar8,0,&stack0xfffffffffffffe48);
  ::std::__cxx11::string::~string((string *)&local_1e0);
  local_1bc = iVar5;
  if (iVar5 != 0) {
    local_1f8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_1f8.filename = local_1f8.filename + 1;
    local_1f8.line = 0x8cf;
    local_1f8.funcname = "SetTxInUtxo";
    logger::warn<int&>(&local_1f8,"wally_tx_from_hex NG[{}]",&local_1bc);
    local_21a = 1;
    pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_218,"psbt tx from hex error.",&local_219);
    CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,&local_218);
    local_21a = 0;
    __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if ((*(long *)(lStack_1b8 + 0x10) != 0) && (*(long *)(lStack_1b8 + 0x28) != 0)) {
    local_1bc = wally_psbt_input_set_utxo
                          (*(long *)((long)pvVar1 + 0x10) + (ulong)index * 0x110,lStack_1b8);
    if (local_1bc != 0) {
      wally_tx_free(lStack_1b8);
      local_278.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_278.filename = local_278.filename + 1;
      local_278.line = 0x8db;
      local_278.funcname = "SetTxInUtxo";
      logger::warn<int&>(&local_278,"wally_psbt_input_set_utxo NG[{}]",&local_1bc);
      local_29a = 1;
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_298,"psbt add utxo error.",&local_299);
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,&local_298);
      local_29a = 0;
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    if (((local_171 & 1) != 0) &&
       (local_1bc = wally_psbt_input_set_witness_utxo
                              (*(long *)((long)pvVar1 + 0x10) + (ulong)index * 0x110,
                               *(long *)(lStack_1b8 + 0x20) + (ulong)index_00 * 0x70),
       local_1bc != 0)) {
      wally_tx_free(lStack_1b8);
      local_2b8.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
                   ,0x2f);
      local_2b8.filename = local_2b8.filename + 1;
      local_2b8.line = 0x8e3;
      local_2b8.funcname = "SetTxInUtxo";
      logger::warn<int&>(&local_2b8,"wally_psbt_input_set_witness_utxo NG[{}]",&local_1bc);
      local_2da = 1;
      pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&local_2d8,"psbt add witness utxo error.",&local_2d9)
      ;
      CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,&local_2d8);
      local_2da = 0;
      __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_1bc = 0;
    wally_tx_free(lStack_1b8);
    bVar3 = local_171;
    lVar2 = *(long *)((long)pvVar1 + 0x10);
    AbstractTxOutReference::GetLockingScript
              (&local_318,
               (AbstractTxOutReference *)
               &new_redeem_script.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    SetPsbtTxInScriptAndKeyList
              ((wally_psbt_input *)(lVar2 + (ulong)index * 0x110),(bool)(bVar3 & 1),
               (Script *)local_170,key_list,&local_318);
    Script::~Script(&local_318);
    Script::~Script((Script *)local_170);
    TxOutReference::~TxOutReference
              ((TxOutReference *)
               &new_redeem_script.script_stack_.
                super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_80);
    Txid::~Txid((Txid *)&tx_txid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage);
    return;
  }
  wally_tx_free(lStack_1b8);
  local_238.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/src/cfdcore_psbt.cpp"
               ,0x2f);
  local_238.filename = local_238.filename + 1;
  local_238.line = 0x8d4;
  local_238.funcname = "SetTxInUtxo";
  logger::warn<>(&local_238,"invalind utxo transaction format.");
  local_25a = 1;
  pCVar7 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_258,"psbt invalid tx error.",&local_259);
  CfdException::CfdException(pCVar7,kCfdIllegalArgumentError,&local_258);
  local_25a = 0;
  __cxa_throw(pCVar7,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Psbt::SetTxInUtxo(
    uint32_t index, const Transaction &tx, const Script &redeem_script,
    const std::vector<KeyData> &key_list) {
  CheckTxInIndex(index, __LINE__, __FUNCTION__);
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  uint8_t *txhash = psbt_pointer->tx->inputs[index].txhash;
  uint32_t vout = psbt_pointer->tx->inputs[index].index;
  auto txid = tx.GetTxid();
  auto tx_txid = txid.GetData().GetBytes();
  if ((memcmp(txhash, tx_txid.data(), tx_txid.size()) != 0) ||
      (vout >= tx.GetTxOutCount())) {
    warn(CFD_LOG_SOURCE, "unmatch outpoint.");
    throw CfdException(kCfdIllegalArgumentError, "unmatch outpoint.");
  }

  auto txout = tx.GetTxOut(vout);
  Script new_redeem_script = redeem_script;
  bool is_witness = ValidatePsbtUtxo(
      txid, vout, txout.GetLockingScript(), redeem_script, key_list,
      &new_redeem_script);

  struct wally_tx *wally_tx_obj = nullptr;
  int ret = wally_tx_from_hex(tx.GetHex().c_str(), 0, &wally_tx_obj);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_from_hex NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt tx from hex error.");
  } else if (
      (wally_tx_obj->num_inputs == 0) || (wally_tx_obj->num_outputs == 0)) {
    wally_tx_free(wally_tx_obj);
    warn(CFD_LOG_SOURCE, "invalind utxo transaction format.");
    throw CfdException(kCfdIllegalArgumentError, "psbt invalid tx error.");
  }

  ret = wally_psbt_input_set_utxo(&psbt_pointer->inputs[index], wally_tx_obj);
  if (ret != WALLY_OK) {
    wally_tx_free(wally_tx_obj);
    warn(CFD_LOG_SOURCE, "wally_psbt_input_set_utxo NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt add utxo error.");
  }
  if (is_witness) {
    ret = wally_psbt_input_set_witness_utxo(
        &psbt_pointer->inputs[index], &wally_tx_obj->outputs[vout]);
    if (ret != WALLY_OK) {
      wally_tx_free(wally_tx_obj);
      warn(CFD_LOG_SOURCE, "wally_psbt_input_set_witness_utxo NG[{}]", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "psbt add witness utxo error.");
    }
  }
  wally_tx_free(wally_tx_obj);

  SetPsbtTxInScriptAndKeyList(
      &psbt_pointer->inputs[index], is_witness, new_redeem_script, key_list,
      txout.GetLockingScript());
}